

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBGInterface.cpp
# Opt level: O1

int handlesbginterfacecli(SOCKET sockcli,void *pParam)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  char cVar5;
  timeval tv;
  fd_set sock_set;
  RS232PORT SBGInterfacePseudoRS232Port_tmp;
  timeval local_3d8;
  fd_set local_3c8;
  RS232PORT local_348;
  
  memcpy(&local_348,&SBGInterfacePseudoRS232Port,0x318);
  if (local_348.DevType == 2) {
    local_348.s = sockcli;
  }
  iVar2 = sockcli + 0x3f;
  if (-1 < sockcli) {
    iVar2 = sockcli;
  }
  bVar4 = (byte)(sockcli % 0x40);
  bVar1 = bVar4 & 0x3f;
  do {
    cVar5 = '\x02';
    if (bExit == 0) {
      local_3d8.tv_sec = 0;
      local_3d8.tv_usec = 5000;
      local_3c8.fds_bits[0] = 0;
      local_3c8.fds_bits[1] = 0;
      local_3c8.fds_bits[2] = 0;
      local_3c8.fds_bits[3] = 0;
      local_3c8.fds_bits[4] = 0;
      local_3c8.fds_bits[5] = 0;
      local_3c8.fds_bits[6] = 0;
      local_3c8.fds_bits[7] = 0;
      local_3c8.fds_bits[8] = 0;
      local_3c8.fds_bits[9] = 0;
      local_3c8.fds_bits[10] = 0;
      local_3c8.fds_bits[0xb] = 0;
      local_3c8.fds_bits[0xc] = 0;
      local_3c8.fds_bits[0xd] = 0;
      local_3c8.fds_bits[0xe] = 0;
      local_3c8.fds_bits[0xf] = 0;
      local_3c8.fds_bits[iVar2 >> 6] = local_3c8.fds_bits[iVar2 >> 6] | 1L << (bVar4 & 0x3f);
      iVar3 = select(sockcli + 1,(fd_set *)0x0,&local_3c8,(fd_set *)0x0,&local_3d8);
      local_3c8.fds_bits[iVar2 >> 6] =
           local_3c8.fds_bits[iVar2 >> 6] & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
      cVar5 = '\x01';
      if ((iVar3 != -1) && ((iVar3 == 0 || (iVar3 = handlesbginterface(&local_348), iVar3 == 0)))) {
        cVar5 = (bExit != 0) * '\x02';
      }
    }
  } while (cVar5 == '\0');
  return (uint)(cVar5 != '\x02');
}

Assistant:

int handlesbginterfacecli(SOCKET sockcli, void* pParam)
{
	int timeout = 5;
	RS232PORT SBGInterfacePseudoRS232Port_tmp = SBGInterfacePseudoRS232Port;

	UNREFERENCED_PARAMETER(pParam);

	// Not thread-safe...

	if (SBGInterfacePseudoRS232Port_tmp.DevType == TCP_SERVER_TYPE_RS232PORT) SBGInterfacePseudoRS232Port_tmp.s = sockcli;
				
	inithandlesbginterface(&SBGInterfacePseudoRS232Port_tmp);

	for (;;)
	{
		fd_set sock_set;
		int iResult = SOCKET_ERROR;
		struct timeval tv;

		if (bExit) break;

		tv.tv_sec = (long)(timeout/1000);
		tv.tv_usec = (long)((timeout%1000)*1000);

		// Initialize a fd_set and add the socket to it.
		FD_ZERO(&sock_set); 
		FD_SET(sockcli, &sock_set);

		iResult = select((int)sockcli+1, NULL, &sock_set, NULL, &tv);

		// Remove the socket from the set.
		// No need to use FD_ISSET() here, as we only have one socket the return value of select() is 
		// sufficient to know what happened.
		FD_CLR(sockcli, &sock_set); 

		switch (iResult)
		{
		case SOCKET_ERROR:
			return EXIT_FAILURE;
		case 0:
			// The timeout on select() occured.
			break;
		default:
			if (handlesbginterface(&SBGInterfacePseudoRS232Port_tmp) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			break;
		}

		if (bExit) break;
	}

	return EXIT_SUCCESS;
}